

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O3

bool __thiscall
Rotate_BSpline_Segment::intersect(Rotate_BSpline_Segment *this,Ray *ray,Hit *h,float tmin)

{
  double *pdVar1;
  undefined1 (*pauVar2) [64];
  Vector3f *this_00;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer pdVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double *pdVar18;
  bool bVar19;
  float *pfVar20;
  pointer pdVar21;
  pointer pdVar22;
  ulong uVar23;
  double *u;
  Vector3f *pVVar24;
  pointer pdVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar45 [16];
  vector<double,_std::allocator<double>_> z;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> t;
  vector<double,_std::allocator<double>_> f;
  Vector3f pyy_1;
  Vector3f pxx_1;
  Vector3f pxx;
  Vector3f pyy;
  vector<double,_std::allocator<double>_> oo;
  vector<double,_std::allocator<double>_> local_288;
  Ray *local_270;
  float local_268;
  float local_264;
  Vector3f *local_260;
  Vector3f *local_258;
  Hit *local_250;
  vector<double,_std::allocator<double>_> local_248;
  undefined1 local_230 [16];
  double *local_220;
  Vector3f *local_218;
  vector<double,_std::allocator<double>_> local_210;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  Vector3f local_1cc;
  Vector2f *local_1c0;
  Vector3f local_1b8;
  Vector3f local_1ac;
  Vector3f local_1a0;
  Vector3f local_194;
  vector<double,_std::allocator<double>_> local_188;
  Vector2f *local_170;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 auVar44 [16];
  
  (*(this->super_Object)._vptr_Object[1])((BoundingBox *)local_230,this);
  local_250 = h;
  bVar19 = BoundingBox::intersect((BoundingBox *)local_230,ray,tmin,h->t + 0.001);
  if (bVar19) {
    this_00 = &ray->d;
    pfVar20 = Vector3f::operator[](this_00,1);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)*pfVar20),auVar26);
    if (1e-05 <= auVar26._0_4_) {
      operator-(&ray->o);
      pVVar24 = &this->o;
      operator+((Vector3f *)&local_248,pVVar24);
      pfVar20 = Vector3f::operator[]((Vector3f *)local_230,1);
      fVar30 = *pfVar20;
      pfVar20 = Vector3f::operator[](this_00,1);
      fVar3 = *pfVar20;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_230,&this->py);
      if (local_230._8_8_ == local_230._0_8_) {
        local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        if ((double *)local_230._8_8_ == local_220) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_230,(iterator)local_230._8_8_,
                     (double *)&local_248);
        }
        else {
          *(double *)local_230._8_8_ = 0.0;
          local_230._8_8_ = local_230._8_8_ + 8;
        }
      }
      local_258 = (Vector3f *)(double)fVar30;
      *(double *)local_230._0_8_ = (double)local_258 + *(double *)local_230._0_8_;
      if (local_230._0_8_ != local_230._8_8_) {
        auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar23 = 0;
        auVar39 = vpbroadcastq_avx512f();
        auVar37._0_8_ = (double)(1.0 / fVar3);
        auVar37._8_8_ = in_XMM3_Qa;
        auVar39 = vpsrlq_avx512f(auVar39,3);
        auVar27 = vbroadcastsd_avx512f(auVar37);
        do {
          auVar28 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar28,auVar38);
          uVar14 = vpcmpuq_avx512f(auVar28,auVar39,2);
          pdVar1 = (double *)(local_230._0_8_ + uVar23 * 8);
          auVar28._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar1[1];
          auVar28._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar1;
          auVar28._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar1[2];
          auVar28._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar1[3];
          auVar28._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar1[4];
          auVar28._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar1[5];
          auVar28._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar1[6];
          auVar28._56_8_ = (uVar14 >> 7) * (long)pdVar1[7];
          auVar28 = vmulpd_avx512f(auVar28,auVar27);
          pauVar2 = (undefined1 (*) [64])(local_230._0_8_ + uVar23 * 8);
          bVar19 = (bool)((byte)uVar14 & 1);
          auVar29._0_8_ = (ulong)bVar19 * auVar28._0_8_ | (ulong)!bVar19 * (long)*(double *)*pauVar2
          ;
          bVar19 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar29._8_8_ =
               (ulong)bVar19 * auVar28._8_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 8);
          bVar19 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar29._16_8_ =
               (ulong)bVar19 * auVar28._16_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 0x10);
          bVar19 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar29._24_8_ =
               (ulong)bVar19 * auVar28._24_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 0x18);
          bVar19 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar29._32_8_ =
               (ulong)bVar19 * auVar28._32_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 0x20);
          bVar19 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar29._40_8_ =
               (ulong)bVar19 * auVar28._40_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 0x28);
          bVar19 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar29._48_8_ =
               (ulong)bVar19 * auVar28._48_8_ |
               (ulong)!bVar19 * (long)*(double *)((long)*pauVar2 + 0x30);
          auVar29._56_8_ =
               (uVar14 >> 7) * auVar28._56_8_ |
               (ulong)!SUB81(uVar14 >> 7,0) * (long)*(double *)((long)*pauVar2 + 0x38);
          *pauVar2 = auVar29;
          uVar23 = uVar23 + 8;
        } while ((((ulong)(local_230._8_8_ + (-8 - local_230._0_8_)) >> 3) + 8 & 0xfffffffffffffff8)
                 != uVar23);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_248,(vector<double,_std::allocator<double>_> *)local_230);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_288,(vector<double,_std::allocator<double>_> *)local_230);
      for (pdVar25 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar25 !=
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar25 = pdVar25 + 1) {
        pfVar20 = Vector3f::operator[](this_00,0);
        *pdVar25 = (double)*pfVar20 * *pdVar25;
      }
      operator-(&ray->o,pVVar24);
      pfVar20 = Vector3f::operator[]((Vector3f *)&local_210,0);
      pdVar25 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = (double)*pfVar20 +
                   *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (pdVar22 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; pdVar22 != pdVar25; pdVar22 = pdVar22 + 1) {
        pfVar20 = Vector3f::operator[](this_00,2);
        *pdVar22 = (double)*pfVar20 * *pdVar22;
      }
      operator-(&ray->o,pVVar24);
      pfVar20 = Vector3f::operator[]((Vector3f *)&local_210,2);
      *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = (double)*pfVar20 +
                   *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      std::vector<double,_std::allocator<double>_>::vector(&local_a8,&local_248);
      std::vector<double,_std::allocator<double>_>::vector(&local_c0,&local_248);
      poly_mul<double>(&local_90,&local_a8,&local_c0);
      std::vector<double,_std::allocator<double>_>::vector(&local_f0,&local_288);
      std::vector<double,_std::allocator<double>_>::vector(&local_108,&local_288);
      poly_mul<double>(&local_d8,&local_f0,&local_108);
      poly_add<double>(&local_78,&local_90,&local_d8);
      std::vector<double,_std::allocator<double>_>::vector(&local_138,&this->px);
      std::vector<double,_std::allocator<double>_>::vector(&local_150,&this->px);
      poly_mul<double>(&local_120,&local_138,&local_150);
      poly_minus<double>(&local_210,&local_78,&local_120);
      if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<double,_std::allocator<double>_>::vector(&local_168,&local_210);
      Poly_Solver::poly_solve(&local_188,&local_168,this->l,this->r,1e-11);
      if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar19 = false;
      }
      else {
        bVar19 = false;
        local_218 = &local_250->norm;
        local_170 = &local_250->pos;
        local_1f8._0_8_ = (double)tmin;
        pdVar25 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_270 = ray;
        do {
          dVar4 = *pdVar25;
          if ((this->l <= dVar4) && (dVar4 <= this->r)) {
            pdVar22 = (this->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar21 = (this->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            dVar31 = 0.0;
            auVar26 = ZEXT816(0);
            if (pdVar22 != pdVar21) {
              auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
              do {
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *pdVar22;
                auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar9);
                dVar31 = auVar26._0_8_;
                auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                pdVar22 = pdVar22 + 1;
              } while (pdVar22 != pdVar21);
            }
            dVar31 = (dVar31 + (double)local_258) * (double)(1.0 / fVar3);
            if (((double)local_1f8._0_8_ <= dVar31) && (dVar31 < (double)local_250->t)) {
              pdVar22 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar21 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              auVar38 = ZEXT864(0) << 0x40;
              local_1e8 = auVar38._0_16_;
              if (pdVar22 != pdVar21) {
                auVar39 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                do {
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = *pdVar22;
                  local_1e8 = vfmadd231sd_fma(auVar38._0_16_,auVar39._0_16_,auVar10);
                  auVar38 = ZEXT1664(local_1e8);
                  auVar39 = ZEXT864((ulong)(dVar4 * auVar39._0_8_));
                  pdVar22 = pdVar22 + 1;
                } while (pdVar22 != pdVar21);
              }
              local_1c0 = (Vector2f *)CONCAT44(local_1c0._4_4_,(float)dVar31);
              ::operator*(&local_194,(float)dVar31);
              operator+(&local_270->o,&local_194);
              operator-(&local_1cc,pVVar24);
              pfVar20 = Vector3f::operator[](&local_1a0,0);
              local_264 = *pfVar20;
              pfVar20 = Vector3f::operator[](&local_1a0,0);
              local_260 = (Vector3f *)CONCAT44(local_260._4_4_,*pfVar20);
              pfVar20 = Vector3f::operator[](&local_1a0,2);
              local_268 = *pfVar20;
              pfVar20 = Vector3f::operator[](&local_1a0,2);
              auVar26 = vfmadd132ss_fma(ZEXT416((uint)local_260),
                                        ZEXT416((uint)(local_268 * *pfVar20)),
                                        ZEXT416((uint)local_264));
              auVar34._0_8_ = (double)auVar26._0_4_;
              auVar34._8_8_ = auVar26._8_8_;
              auVar26 = vfnmadd213sd_fma(local_1e8,local_1e8,auVar34);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0x7fffffffffffffff;
              auVar17._12_4_ = 0x7fffffff;
              auVar26 = vandpd_avx512vl(auVar26,auVar17);
              if (auVar26._0_8_ <= 0.0001) {
                local_250->t = local_1c0._0_4_;
                local_250->obj = &this->super_Object;
                ::operator*(&local_1ac,local_1c0._0_4_);
                operator+(&local_270->o,&local_1ac);
                operator-(&local_1cc,pVVar24);
                Vector3f::Vector3f(&local_1cc,0.0,1.0,0.0);
                pfVar20 = Vector3f::operator[](&local_194,0);
                local_1e8._0_4_ = *pfVar20;
                pfVar20 = Vector3f::operator[](&local_194,2);
                Vector3f::Vector3f(&local_1b8,(float)local_1e8._0_4_,0.0,*pfVar20);
                Vector3f::normalized(&local_1b8);
                pdVar22 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar21 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (pdVar22 == pdVar21) {
                  fVar30 = 0.0;
                }
                else {
                  auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  auVar26 = ZEXT816(0);
                  do {
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = *pdVar22;
                    auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar11);
                    auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                    pdVar22 = pdVar22 + 1;
                  } while (pdVar22 != pdVar21);
                  fVar30 = (float)auVar26._0_8_;
                }
                ::operator*(&local_3c,fVar30);
                pdVar22 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar21 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (pdVar22 == pdVar21) {
                  fVar30 = 0.0;
                }
                else {
                  auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  auVar26 = ZEXT416(0);
                  do {
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = *pdVar22;
                    auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar12);
                    auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                    pdVar22 = pdVar22 + 1;
                  } while (pdVar22 != pdVar21);
                  fVar30 = (float)auVar26._0_8_;
                }
                ::operator*(&local_48,fVar30);
                operator+(&local_3c,&local_48);
                Vector3f::operator=(local_218,&local_1b8);
                Vector3f::normalize(local_218);
                Vector2f::operator=(local_170,&Vector2f::ZERO);
                bVar19 = true;
              }
            }
          }
          pdVar25 = pdVar25 + 1;
        } while (pdVar25 !=
                 local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_230,&this->py);
      if (local_230._8_8_ == local_230._0_8_) {
        local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        if ((double *)local_230._8_8_ == local_220) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_230,(iterator)local_230._8_8_,
                     (double *)&local_248);
        }
        else {
          *(double *)local_230._8_8_ = 0.0;
          local_230._8_8_ = local_230._8_8_ + 8;
        }
      }
      local_258 = &this->o;
      operator-(local_258,&ray->o);
      pfVar20 = Vector3f::operator[]((Vector3f *)&local_248,1);
      *(double *)local_230._0_8_ = (double)*pfVar20 + *(double *)local_230._0_8_;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,(vector<double,_std::allocator<double>_> *)local_230);
      Poly_Solver::poly_solve(&local_248,&local_60,this->l,this->r,1e-07);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar19 = false;
      }
      else {
        bVar19 = false;
        local_218 = (Vector3f *)
                    local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_260 = &local_250->norm;
        local_1c0 = &local_250->pos;
        pVVar24 = (Vector3f *)
                  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar25 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_270 = ray;
        do {
          dVar4 = *pdVar25;
          if ((this->l <= dVar4) && (dVar4 <= this->r)) {
            pfVar20 = Vector3f::operator[](this_00,0);
            local_1f8._0_8_ = (double)*pfVar20;
            operator-(&local_270->o,local_258);
            pfVar20 = Vector3f::operator[]((Vector3f *)&local_288,0);
            fVar30 = *pfVar20;
            pfVar20 = Vector3f::operator[](this_00,2);
            local_1e8._0_8_ = (double)*pfVar20;
            operator-(&local_270->o,local_258);
            pfVar20 = Vector3f::operator[]((Vector3f *)&local_288,2);
            pdVar22 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar21 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            dVar31 = 0.0;
            auVar26 = ZEXT816(0) << 0x40;
            if (pdVar22 != pdVar21) {
              auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
              do {
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *pdVar22;
                auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar5);
                dVar31 = auVar26._0_8_;
                auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                pdVar22 = pdVar22 + 1;
              } while (pdVar22 != pdVar21);
            }
            dVar35 = (double)*pfVar20;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = local_1f8._0_8_;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = (double)fVar30;
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (double *)0x0;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = (double)local_1e8._0_8_ * (double)local_1e8._0_8_;
            auVar26 = vfmadd231sd_fma(auVar44,auVar40,auVar40);
            dVar43 = auVar26._0_8_;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = (double)local_1f8._0_8_ + (double)local_1f8._0_8_;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = ((double)local_1e8._0_8_ + (double)local_1e8._0_8_) * dVar35;
            local_1f8 = vfmadd231sd_fma(auVar42,auVar45,auVar41);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = dVar35 * dVar35;
            auVar26 = vfmadd231sd_fma(auVar36,auVar45,auVar45);
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (double *)0x0;
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (double *)0x0;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar43 * -4.0 * (auVar26._0_8_ - dVar31 * dVar31);
            auVar26 = vfmadd231sd_fma(auVar32,local_1f8,local_1f8);
            dVar31 = auVar26._0_8_;
            if (dVar31 >= 0.0) {
              if (dVar31 < 0.0) {
                dVar31 = sqrt(dVar31);
              }
              else {
                auVar26 = vsqrtsd_avx(auVar26,auVar26);
                dVar31 = auVar26._0_8_;
              }
              auVar15._12_4_ = 0x80000000;
              auVar15._0_12_ = ZEXT812(0x8000000000000000);
              auVar26 = vxorpd_avx512vl(local_1f8,auVar15);
              local_1e8._0_8_ = dVar43 + dVar43;
              local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((auVar26._0_8_ - dVar31) / (dVar43 + dVar43));
              if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&local_288,
                           (iterator)
                           local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&local_210);
              }
              else {
                *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (double)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((dVar31 - (double)local_1f8._0_8_) / (double)local_1e8._0_8_);
              if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&local_288,
                           (iterator)
                           local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&local_210);
                pdVar1 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar18 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              else {
                *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (double)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                pdVar1 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar18 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              for (; pdVar22 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,
                  pdVar1 != local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
                dVar31 = *pdVar1;
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = pdVar18;
                if (((double)tmin <= dVar31) && (dVar31 < (double)local_250->t)) {
                  pdVar21 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar13 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  auVar38 = ZEXT864(0) << 0x40;
                  local_1f8 = auVar38._0_16_;
                  if (pdVar21 != pdVar13) {
                    auVar39 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    do {
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = *pdVar21;
                      local_1f8 = vfmadd231sd_fma(auVar38._0_16_,auVar39._0_16_,auVar6);
                      auVar38 = ZEXT1664(local_1f8);
                      auVar39 = ZEXT864((ulong)(dVar4 * auVar39._0_8_));
                      pdVar21 = pdVar21 + 1;
                    } while (pdVar21 != pdVar13);
                  }
                  local_268 = (float)dVar31;
                  ::operator*((Vector3f *)&local_210,local_268);
                  operator+(&local_270->o,(Vector3f *)&local_210);
                  operator-(&local_194,local_258);
                  pfVar20 = Vector3f::operator[]((Vector3f *)&local_188,0);
                  fVar30 = *pfVar20;
                  pfVar20 = Vector3f::operator[]((Vector3f *)&local_188,0);
                  local_1e8._0_4_ = *pfVar20;
                  pfVar20 = Vector3f::operator[]((Vector3f *)&local_188,2);
                  local_264 = *pfVar20;
                  pfVar20 = Vector3f::operator[]((Vector3f *)&local_188,2);
                  auVar26 = vfmadd132ss_fma(ZEXT416((uint)local_1e8._0_4_),
                                            ZEXT416((uint)(local_264 * *pfVar20)),
                                            ZEXT416((uint)fVar30));
                  auVar33._0_8_ = (double)auVar26._0_4_;
                  auVar33._8_8_ = auVar26._8_8_;
                  auVar26 = vfnmadd213sd_fma(local_1f8,local_1f8,auVar33);
                  auVar16._8_4_ = 0xffffffff;
                  auVar16._0_8_ = 0x7fffffffffffffff;
                  auVar16._12_4_ = 0x7fffffff;
                  auVar26 = vandpd_avx512vl(auVar26,auVar16);
                  if (auVar26._0_8_ <= 0.001) {
                    local_250->t = local_268;
                    local_250->obj = &this->super_Object;
                    ::operator*(&local_1a0,local_268);
                    operator+(&local_270->o,&local_1a0);
                    operator-(&local_194,local_258);
                    Vector3f::Vector3f(&local_194,0.0,1.0,0.0);
                    pfVar20 = Vector3f::operator[]((Vector3f *)&local_210,0);
                    local_1f8._0_4_ = *pfVar20;
                    pfVar20 = Vector3f::operator[]((Vector3f *)&local_210,2);
                    Vector3f::Vector3f(&local_1cc,(float)local_1f8._0_4_,0.0,*pfVar20);
                    Vector3f::normalized(&local_1cc);
                    pdVar21 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start;
                    pdVar13 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish;
                    if (pdVar21 == pdVar13) {
                      fVar30 = 0.0;
                    }
                    else {
                      auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                      auVar26 = ZEXT816(0);
                      do {
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = *pdVar21;
                        auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar7);
                        auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                        pdVar21 = pdVar21 + 1;
                      } while (pdVar21 != pdVar13);
                      fVar30 = (float)auVar26._0_8_;
                    }
                    ::operator*(&local_1ac,fVar30);
                    pdVar21 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start;
                    pdVar13 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish;
                    if (pdVar21 == pdVar13) {
                      fVar30 = 0.0;
                    }
                    else {
                      auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                      auVar26 = ZEXT416(0);
                      do {
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = *pdVar21;
                        auVar26 = vfmadd231sd_fma(auVar26,auVar38._0_16_,auVar8);
                        auVar38 = ZEXT864((ulong)(dVar4 * auVar38._0_8_));
                        pdVar21 = pdVar21 + 1;
                      } while (pdVar21 != pdVar13);
                      fVar30 = (float)auVar26._0_8_;
                    }
                    ::operator*(&local_1b8,fVar30);
                    operator+(&local_1ac,&local_1b8);
                    Vector3f::operator=(local_260,&local_1cc);
                    Vector3f::normalize(local_260);
                    operator-(this_00);
                    fVar30 = Vector3f::dot(local_260,&local_1cc);
                    pVVar24 = local_260;
                    if (fVar30 < 0.0) {
                      operator-(local_260);
                      Vector3f::operator=(pVVar24,&local_1cc);
                    }
                    Vector2f::operator=(local_1c0,&Vector2f::ZERO);
                    bVar19 = true;
                  }
                }
                pdVar18 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = pdVar22;
              }
              pVVar24 = local_218;
              local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = pdVar18;
              if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (double *)0x0) {
                operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
                pVVar24 = local_218;
              }
            }
          }
          pdVar25 = pdVar25 + 1;
        } while ((Vector3f *)pdVar25 != pVVar24);
      }
    }
    if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((double *)local_230._0_8_ != (double *)0x0) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  else {
    bVar19 = false;
  }
  return bVar19;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		if (!this->getBound().intersect(ray, tmin, h.t + 1e-3)) return 0;
		//(ray.o+ray.d*t-o)_y=py(u)
		//((ray.o+ray.d*t-o)_x)^2+((ray.o+ray.d*t-o)_z)^2-px(u)^2=0
		//t=(py(u)+Y(-ray.o+o))/Y(ray.d)
		if (fabs(ray.d[1]) < 1e-5) { //almost pararrel
			//py(u)=(ray.o-o)_y
			std::vector<double> f = py;
			if (!f.size()) f.push_back(0);
			f[0]+=(o - ray.o)[1];
			std::vector<double> oo = poly_solve(f, l, r, 1e-7);
			bool suc = 0;
			for (auto u : oo) {
				if (u<l || u>r) continue;
				double k1 = ray.d[0], b1 = (ray.o - o)[0], k2 = ray.d[2], b2 = (ray.o - o)[2], b=poly_calc(px,u);
				b = -b * b;
				//(k1*t+b1)^2+(k2*t+b2)^2+b=0
				double A = k1 * k1 + k2 * k2, B = 2 * k1 * b1 + 2 * k2 * b2, C = b1 * b1 + b2 * b2 + b;
				std::vector<double> og;
				double dt = B * B - 4 * A * C;
				if (dt >= 0) {
					dt = sqrt(dt);
					og.push_back((-B - dt) / (2 * A));
					og.push_back((-B + dt) / (2 * A));
				}
				for(auto g:og)
				if (g >= tmin && g < h.t) {
					double gx = poly_calc(px, u);
					Vector3f f = ray.pos(g) - o;
					double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
					if (fabs(l) > 1e-3) continue;
					h.t = g; h.obj = this;
					Vector3f pos = ray.o + ray.d * h.t - o,
						pyy = Vector3f(0, 1, 0),
						pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//					double X = poly_calc(px, u), Y = poly_calc(py, u);
//					cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
					h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
					h.norm.normalize();
					if (Vector3f::dot(h.norm, -ray.d) < 0) h.norm = -h.norm;
					//todo: add pos, too lazy atm
					h.pos = Vector2f::ZERO; suc = 1;
				}
			}
			return suc;
		}
		float b1 = (-ray.o + o)[1], k1 = 1.0 / ray.d[1];
		//t=(py(u)+b1)*k1
		std::vector<double> t = py;
		if (!t.size()) t.push_back(0);
		t[0] += b1;
		for (auto& u : t) u *= k1;
		std::vector<double> x = t, z = t;
		for (auto& u : x) u *= ray.d[0];
		x[0] += (ray.o - o)[0];
		for (auto& u : z) u *= ray.d[2];
		z[0] += (ray.o - o)[2];
		std::vector<double> f = poly_minus(poly_add(poly_mul(x, x), poly_mul(z, z)), poly_mul(px, px));
		std::vector<double> oo = poly_solve(f, l, r, 1e-11);
//		std::cerr << "good!" << f.size() << "w" << oo.size() << "!";
//		for (auto c : oo) std::cerr << c << "|"<<poly_calc(px,c)<<"|"<<poly_calc(f,c)<<","; std::cerr << "\n";
		bool suc = 0;
		for (auto u : oo) {
			if (u<l || u>r) continue;
			double g = poly_calc(py, u);
			g = (g + b1) * k1;
			if (g >= tmin && g < h.t) {
				double gx = poly_calc(px, u);
				Vector3f f = ray.pos(g) - o;
				double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
				if (fabs(l) > 1e-4) continue;
				h.t = g; h.obj = this;
				Vector3f pos = ray.o + ray.d * h.t - o,
					pyy = Vector3f(0, 1, 0),
					pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//				double X = poly_calc(px, u), Y = poly_calc(py, u);
//				cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
//				cerr<<pos[1]<<" "<<pos[0]*pos[0]+pos[2]*pos[2]<<"  "<<poly_calc(px,u)<<" "<<
				h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
				h.norm.normalize();
				//if (Vector3f::dot(h.norm, -ray.d)<0) h.norm = -h.norm;
				//todo: add pos, too lazy atm
				h.pos = Vector2f::ZERO; suc = 1;
			}
		}
		return suc;
	}